

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void google::protobuf::compiler::java::
     GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
               (string *package_dir,string *java_package,Descriptor *descriptor,
               GeneratorContext *context,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *file_list,bool annotate_code,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *annotation_list,string *name_suffix,MessageGenerator *generator,
               offset_in_MessageGenerator_to_subr pfn)

{
  FileDescriptor *this;
  ulong uVar1;
  long *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char (*in_RDI) [9];
  byte in_R9B;
  long in_stack_00000018;
  value_type *in_stack_00000020;
  long in_stack_00000028;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  info_output;
  Printer printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  string info_full_path;
  string filename;
  GeneratedCodeInfo *in_stack_fffffffffffffdd8;
  Printer *in_stack_fffffffffffffde0;
  value_type *in_stack_fffffffffffffde8;
  value_type *__x;
  Printer *in_stack_fffffffffffffdf0;
  value_type *this_00;
  GeneratedCodeInfo *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  string *text;
  ZeroCopyOutputStream in_stack_fffffffffffffe40;
  undefined1 local_1b8 [32];
  ZeroCopyOutputStream *in_stack_fffffffffffffe68;
  MessageLite *in_stack_fffffffffffffe70;
  string local_d0 [48];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  value_type *local_40;
  long local_38;
  byte local_29;
  long *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_29 = in_R9B & 1;
  local_38 = in_stack_00000028;
  local_40 = in_stack_00000020;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Descriptor::name_abi_cxx11_((Descriptor *)in_RDX);
  text = local_a0;
  std::operator+(in_stack_fffffffffffffe08,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe00);
  std::operator+(in_stack_fffffffffffffde8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffde0);
  std::operator+(in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->variable_delimiter_);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
  GeneratedCodeInfo::GeneratedCodeInfo(in_stack_fffffffffffffe00);
  io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AnnotationProtoCollector
            ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
             in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  (**(code **)(*local_20 + 0x10))(local_20,local_60);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              *)in_stack_fffffffffffffde0,(pointer)in_stack_fffffffffffffdd8);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
         *)in_stack_fffffffffffffde0);
  io::Printer::Printer
            (in_stack_fffffffffffffdf0,(ZeroCopyOutputStream *)in_stack_fffffffffffffde8,
             (char)((ulong)in_stack_fffffffffffffde0 >> 0x38),
             (AnnotationCollector *)in_stack_fffffffffffffdd8);
  this = Descriptor::file((Descriptor *)local_18);
  FileDescriptor::name_abi_cxx11_(this);
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)in_stack_fffffffffffffe40._vptr_ZeroCopyOutputStream,(char *)text,in_RDI,
             in_RDX);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    io::Printer::Print<char[8],std::__cxx11::string>
              ((Printer *)in_stack_fffffffffffffe40._vptr_ZeroCopyOutputStream,(char *)text,
               (char (*) [8])in_RDI,in_RDX);
  }
  __x = local_40;
  if (((ulong)local_40 & 1) != 0) {
    __x = *(value_type **)((long)local_40 + *(long *)(in_stack_00000018 + local_38) + -1);
  }
  (*(code *)__x)((long *)(in_stack_00000018 + local_38),local_1b8);
  this_00 = local_40;
  if ((local_29 & 1) != 0) {
    in_stack_fffffffffffffde0 = (Printer *)(**(code **)(*local_20 + 0x10))(local_20,local_d0);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                *)in_stack_fffffffffffffde0,(pointer)&stack0xfffffffffffffe40);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
           *)in_stack_fffffffffffffde0);
    MessageLite::SerializeToZeroCopyStream(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40,__x);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)local_40);
    this_00 = local_40;
  }
  io::Printer::~Printer(in_stack_fffffffffffffde0);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 *)this_00);
  io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::~AnnotationProtoCollector
            ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x5346e4);
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)in_stack_fffffffffffffde0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

static void GenerateSibling(
    const std::string& package_dir, const std::string& java_package,
    const DescriptorClass* descriptor, GeneratorContext* context,
    std::vector<std::string>* file_list, bool annotate_code,
    std::vector<std::string>* annotation_list, const std::string& name_suffix,
    GeneratorClass* generator,
    void (GeneratorClass::*pfn)(io::Printer* printer)) {
  std::string filename =
      package_dir + descriptor->name() + name_suffix + ".java";
  file_list->push_back(filename);
  std::string info_full_path = filename + ".pb.meta";
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$',
                      annotate_code ? &annotation_collector : NULL);

  printer.Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", descriptor->file()->name());
  if (!java_package.empty()) {
    printer.Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
  }

  (generator->*pfn)(&printer);

  if (annotate_code) {
    std::unique_ptr<io::ZeroCopyOutputStream> info_output(
        context->Open(info_full_path));
    annotations.SerializeToZeroCopyStream(info_output.get());
    annotation_list->push_back(info_full_path);
  }
}